

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_quaternion_to_axis_angle(rf_quaternion q,rf_vec3 *outAxis,float *outAngle)

{
  undefined1 auVar1 [16];
  float fVar2;
  uint uVar3;
  double dVar4;
  ulong uVar5;
  undefined8 extraout_XMM0_Qb;
  undefined1 extraout_var [12];
  undefined1 auVar6 [16];
  undefined1 auVar9 [16];
  rf_quaternion rVar10;
  float local_38;
  undefined8 local_28;
  rf_quaternion rStack_20;
  undefined1 auVar7 [16];
  undefined4 uVar8;
  
  fVar2 = q.w;
  local_28 = q._0_8_;
  if (ABS(fVar2) <= 1.0) {
    local_38 = q.z;
    rStack_20._0_8_ = q._0_8_;
  }
  else {
    rVar10 = rf_quaternion_normalize(q);
    fVar2 = rVar10.w;
    local_28 = rVar10._0_8_;
    local_38 = rVar10.z;
    rStack_20._0_8_ = extraout_XMM0_Qb;
  }
  dVar4 = acos((double)fVar2);
  fVar2 = 1.0 - fVar2 * fVar2;
  if (fVar2 < 0.0) {
    auVar9._0_4_ = sqrtf(fVar2);
    auVar9._4_12_ = extraout_var;
    uVar5 = auVar9._0_8_;
  }
  else {
    uVar5 = (ulong)(uint)SQRT(fVar2);
  }
  fVar2 = 0.0;
  auVar6._0_4_ = (float)uVar5;
  if (0.0001 < auVar6._0_4_) {
    fVar2 = local_38 / auVar6._0_4_;
  }
  uVar8 = (undefined4)(uVar5 >> 0x20);
  auVar7._8_4_ = uVar8;
  auVar7._0_8_ = uVar5;
  auVar7._12_4_ = uVar8;
  auVar6._8_8_ = auVar7._8_8_;
  auVar6._4_4_ = auVar6._0_4_;
  auVar1._8_4_ = rStack_20.x;
  auVar1._12_4_ = rStack_20.y;
  auVar1._0_8_ = local_28;
  auVar9 = divps(auVar1,auVar6);
  uVar3 = (int)((uint)(0.0001 < auVar6._0_4_) << 0x1f) >> 0x1f;
  uVar5 = (ulong)(~uVar3 & 0x3f800000) |
          CONCAT44(auVar9._4_4_ & (int)((uint)(0.0001 < auVar6._0_4_) << 0x1f) >> 0x1f,
                   auVar9._0_4_ & uVar3);
  outAxis->x = (float)(int)uVar5;
  outAxis->y = (float)(int)(uVar5 >> 0x20);
  outAxis->z = fVar2;
  *outAngle = (float)dVar4 + (float)dVar4;
  return;
}

Assistant:

RF_API void rf_quaternion_to_axis_angle(rf_quaternion q, rf_vec3 *outAxis, float *outAngle)
{
    if (fabs(q.w) > 1.0f) q = rf_quaternion_normalize(q);

    rf_vec3 resAxis = {0.0f, 0.0f, 0.0f};
    float resAngle = 0.0f;

    resAngle = 2.0f * (float) acos(q.w);
    float den = (float) sqrt(1.0f - q.w * q.w);

    if (den > 0.0001f)
    {
        resAxis.x = q.x / den;
        resAxis.y = q.y / den;
        resAxis.z = q.z / den;
    } else
    {
        // This occurs when the angle is zero.
        // Not a problem: just set an arbitrary normalized axis.
        resAxis.x = 1.0f;
    }

    *outAxis = resAxis;
    *outAngle = resAngle;
}